

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O0

void __thiscall
btSoftBodyCollisionShape::getAabb
          (btSoftBodyCollisionShape *this,btTransform *t,btVector3 *aabbMin,btVector3 *aabbMax)

{
  btTransform *this_00;
  btVector3 *other;
  btScalar *pbVar1;
  btScalar *pbVar2;
  btScalar *pbVar3;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  btVector3 *in_RSI;
  long in_RDI;
  btVector3 bVar4;
  int i;
  btVector3 crns [8];
  btVector3 maxs;
  btVector3 mins;
  btVector3 *in_stack_fffffffffffffd98;
  int local_14c;
  btVector3 local_148;
  btVector3 local_138;
  btVector3 local_128;
  btVector3 local_118;
  btVector3 local_108;
  btVector3 local_f8;
  btVector3 local_e8;
  btVector3 local_d8;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  btVector3 local_48;
  btVector3 local_38;
  undefined8 *local_20;
  undefined8 *local_18;
  
  local_38.m_floats._0_8_ = *(undefined8 *)(*(long *)(in_RDI + 0x20) + 0x494);
  local_38.m_floats._8_8_ = *(undefined8 *)(*(long *)(in_RDI + 0x20) + 0x49c);
  local_48.m_floats._0_8_ = *(undefined8 *)(*(long *)(in_RDI + 0x20) + 0x4a4);
  local_48.m_floats._8_8_ = *(undefined8 *)(*(long *)(in_RDI + 0x20) + 0x4ac);
  local_20 = in_RCX;
  local_18 = in_RDX;
  this_00 = (btTransform *)btVector3::x(&local_38);
  other = (btVector3 *)btVector3::y(&local_38);
  pbVar1 = btVector3::z(&local_38);
  btVector3::btVector3(&local_d8,(btScalar *)this_00,other->m_floats,pbVar1);
  bVar4 = btTransform::operator*(this_00,in_stack_fffffffffffffd98);
  local_c0 = bVar4.m_floats._8_8_;
  local_c8 = bVar4.m_floats._0_8_;
  pbVar1 = btVector3::x(&local_48);
  pbVar2 = btVector3::y(&local_38);
  pbVar3 = btVector3::z(&local_38);
  btVector3::btVector3(&local_e8,pbVar1,pbVar2,pbVar3);
  bVar4 = btTransform::operator*(this_00,in_stack_fffffffffffffd98);
  local_b0 = bVar4.m_floats._8_8_;
  local_b8 = bVar4.m_floats._0_8_;
  pbVar1 = btVector3::x(&local_48);
  pbVar2 = btVector3::y(&local_48);
  pbVar3 = btVector3::z(&local_38);
  btVector3::btVector3(&local_f8,pbVar1,pbVar2,pbVar3);
  bVar4 = btTransform::operator*(this_00,in_stack_fffffffffffffd98);
  local_a0 = bVar4.m_floats._8_8_;
  local_a8 = bVar4.m_floats._0_8_;
  pbVar1 = btVector3::x(&local_38);
  pbVar2 = btVector3::y(&local_48);
  pbVar3 = btVector3::z(&local_38);
  btVector3::btVector3(&local_108,pbVar1,pbVar2,pbVar3);
  bVar4 = btTransform::operator*(this_00,in_stack_fffffffffffffd98);
  local_90 = bVar4.m_floats._8_8_;
  local_98 = bVar4.m_floats._0_8_;
  pbVar1 = btVector3::x(&local_38);
  pbVar2 = btVector3::y(&local_38);
  pbVar3 = btVector3::z(&local_48);
  btVector3::btVector3(&local_118,pbVar1,pbVar2,pbVar3);
  bVar4 = btTransform::operator*(this_00,in_stack_fffffffffffffd98);
  local_80 = bVar4.m_floats._8_8_;
  local_88 = bVar4.m_floats._0_8_;
  pbVar1 = btVector3::x(&local_48);
  pbVar2 = btVector3::y(&local_38);
  pbVar3 = btVector3::z(&local_48);
  btVector3::btVector3(&local_128,pbVar1,pbVar2,pbVar3);
  bVar4 = btTransform::operator*(this_00,in_stack_fffffffffffffd98);
  local_70 = bVar4.m_floats._8_8_;
  local_78 = bVar4.m_floats._0_8_;
  pbVar1 = btVector3::x(&local_48);
  pbVar2 = btVector3::y(&local_48);
  pbVar3 = btVector3::z(&local_48);
  btVector3::btVector3(&local_138,pbVar1,pbVar2,pbVar3);
  bVar4 = btTransform::operator*(this_00,in_stack_fffffffffffffd98);
  local_60 = bVar4.m_floats._8_8_;
  local_68 = bVar4.m_floats._0_8_;
  pbVar1 = btVector3::x(&local_38);
  pbVar2 = btVector3::y(&local_48);
  pbVar3 = btVector3::z(&local_48);
  btVector3::btVector3(&local_148,pbVar1,pbVar2,pbVar3);
  bVar4 = btTransform::operator*(this_00,in_stack_fffffffffffffd98);
  local_50 = bVar4.m_floats._8_8_;
  local_58 = bVar4.m_floats._0_8_;
  *local_20 = local_c8;
  local_20[1] = local_c0;
  *local_18 = *local_20;
  local_18[1] = local_20[1];
  for (local_14c = 1; local_14c < 8; local_14c = local_14c + 1) {
    btVector3::setMin(in_RSI,other);
    btVector3::setMax(in_RSI,other);
  }
  return;
}

Assistant:

virtual void getAabb(const btTransform& t,btVector3& aabbMin,btVector3& aabbMax) const
	{
		/* t is usually identity, except when colliding against btCompoundShape. See Issue 512 */
		const btVector3	mins=m_body->m_bounds[0];
		const btVector3	maxs=m_body->m_bounds[1];
		const btVector3	crns[]={t*btVector3(mins.x(),mins.y(),mins.z()),
			t*btVector3(maxs.x(),mins.y(),mins.z()),
			t*btVector3(maxs.x(),maxs.y(),mins.z()),
			t*btVector3(mins.x(),maxs.y(),mins.z()),
			t*btVector3(mins.x(),mins.y(),maxs.z()),
			t*btVector3(maxs.x(),mins.y(),maxs.z()),
			t*btVector3(maxs.x(),maxs.y(),maxs.z()),
			t*btVector3(mins.x(),maxs.y(),maxs.z())};
		aabbMin=aabbMax=crns[0];
		for(int i=1;i<8;++i)
		{
			aabbMin.setMin(crns[i]);
			aabbMax.setMax(crns[i]);
		}
	}